

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_MMDP_OnlineSolve.cpp
# Opt level: O2

double runSimulations(PlanningUnitDecPOMDPDiscrete *pu,SimulationDecPOMDPDiscrete *sim)

{
  long *plVar1;
  ulong uVar2;
  AgentQLearner *pAVar3;
  ostream *os;
  basic_ostream<char,_std::char_traits<char>_> *pbVar4;
  ulong uVar5;
  uint uVar6;
  undefined8 uVar7;
  vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> agents;
  row_t row;
  SimulationResult result;
  QTable q;
  referred_type local_f0;
  AgentQLearner agent;
  
  plVar1 = *(long **)(pu + 0x330);
  uVar7 = (**(code **)(*(long *)((long)plVar1 + *(long *)(*plVar1 + -0xb0)) + 0x70))
                    ((long)plVar1 + *(long *)(*plVar1 + -0xb0));
  uVar5 = 0;
  AgentQLearner::AgentQLearner
            ((AgentQLearner *)0x0,0x3fb999999999999a,0x3feccccccccccccd,uVar7,0x3fd999999999999a,
             &agent,pu,0,2);
  agents.super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  agents.super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  agents.super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  while( true ) {
    uVar2 = (**(code **)(*(long *)pu + 0x30))(pu);
    if (uVar2 <= uVar5) break;
    pAVar3 = (AgentQLearner *)operator_new(0x98);
    AgentQLearner::AgentQLearner(pAVar3,&agent);
    (**(code **)(*(long *)(pAVar3 + *(long *)(*(long *)pAVar3 + -0x18)) + 0x18))
              (pAVar3 + *(long *)(*(long *)pAVar3 + -0x18),uVar5);
    _result = pAVar3;
    std::vector<AgentFullyObservable*,std::allocator<AgentFullyObservable*>>::
    emplace_back<AgentFullyObservable*>
              ((vector<AgentFullyObservable*,std::allocator<AgentFullyObservable*>> *)&agents,
               (AgentFullyObservable **)&result);
    uVar5 = (ulong)((int)uVar5 + 1);
    *(AgentFullyObservable **)(pAVar3 + 0x78) =
         *agents.super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
          ._M_impl.super__Vector_impl_data._M_start;
  }
  SimulationDecPOMDPDiscrete::RunSimulations<AgentFullyObservable>
            ((SimulationDecPOMDPDiscrete *)&result,
             (vector<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_> *)sim);
  QTable::QTable(&q,(QTable *)
                    (*agents.
                      super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                      ._M_impl.super__Vector_impl_data._M_start + 8));
  row.data_.e_ = &local_f0;
  row.i_ = 0;
  *(undefined8 *)(std::__throw_bad_array_new_length + *(long *)(std::cout + -0x18)) = 7;
  os = std::operator<<((ostream *)&std::cout,
                       "Here\'s first row (state 0) from Q-learning result: \n");
  pbVar4 = boost::numeric::ublas::operator<<
                     ((basic_ostream<char,_std::char_traits<char>_> *)os,
                      (vector_expression<boost::numeric::ublas::matrix_row<const_boost::numeric::ublas::matrix<double,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>_>_>_>
                       *)&row);
  std::endl<char,std::char_traits<char>>((ostream *)pbVar4);
  pAVar3 = _result;
  uVar6 = 0;
  while( true ) {
    uVar5 = (**(code **)(*(long *)pu + 0x30))(pu);
    if (uVar5 <= uVar6) break;
    if (agents.super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar6] != (AgentFullyObservable *)0x0) {
      (**(code **)(*(long *)agents.
                            super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar6] + 8))();
    }
    uVar6 = uVar6 + 1;
  }
  boost::numeric::ublas::unbounded_array<double,_std::allocator<double>_>::~unbounded_array
            (&local_f0.data_);
  SimulationResult::~SimulationResult(&result);
  std::_Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>::~_Vector_base
            (&agents.
              super__Vector_base<AgentFullyObservable_*,_std::allocator<AgentFullyObservable_*>_>);
  AgentQLearner::~AgentQLearner(&agent);
  return (double)pAVar3;
}

Assistant:

double runSimulations(const PlanningUnitDecPOMDPDiscrete *pu,
                      const SimulationDecPOMDPDiscrete &sim)
{
    // create 'template' agent from which others are created
    AgentQLearner agent(pu, 0, 0.0, 0.1, 0.9, pu->GetDiscount());

    AgentQLearner *newAgent;
    vector<AgentFullyObservable*> agents;

    for(Index i=0; i < pu->GetNrAgents(); i++)
    {
        newAgent=new AgentQLearner(agent);
        newAgent->SetIndex(i);
        agents.push_back(newAgent);
        
        // Only one agent, id 0, is learning the joint policy in this example.
        // Others merely look up their action component from that joint learner.
        newAgent->SetFirstAgent(static_cast<AgentQLearner*>(agents[0]));
    }
    SimulationResult result = sim.RunSimulations(agents);

    QTable q = static_cast<AgentQLearner*>(agents[0])->GetQTable();
    row_t row   = q.GetRow(0);
    cout << setprecision(7)
         << "Here's first row (state 0) from Q-learning result: \n" << row << endl;

    double avgReward = result.GetAvgReward();
    for(Index i=0; i < pu->GetNrAgents(); i++)
        delete agents[i];

    return avgReward;
}